

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_hash.c
# Opt level: O3

void adt_hash_set(adt_hash_t *self,char *pKey,void *pVal)

{
  adt_hnode_t *node;
  uint32_t u32Hash;
  char *pcVar1;
  adt_hkey_t *paVar2;
  uint uVar3;
  char cVar4;
  
  if (pKey != (char *)0x0 && self != (adt_hash_t *)0x0) {
    cVar4 = *pKey;
    if (cVar4 == '\0') {
      uVar3 = 0;
    }
    else {
      pcVar1 = pKey + 1;
      uVar3 = 0;
      do {
        uVar3 = ((int)cVar4 + uVar3) * 0x401;
        uVar3 = uVar3 >> 6 ^ uVar3;
        cVar4 = *pcVar1;
        pcVar1 = pcVar1 + 1;
      } while (cVar4 != '\0');
      uVar3 = uVar3 * 9;
    }
    u32Hash = (uVar3 >> 0xb ^ uVar3) * 0x8001;
    node = self->root;
    paVar2 = adt_hnode_find(node,pKey,u32Hash);
    if (paVar2 == (adt_hkey_t *)0x0) {
      paVar2 = (adt_hkey_t *)malloc(0x18);
      if (paVar2 != (adt_hkey_t *)0x0) {
        pcVar1 = strdup(pKey);
        paVar2->key = pcVar1;
        paVar2->val = pVal;
        paVar2->next = (adt_hkey_tag *)0x0;
        adt_hnode_insert(node,paVar2,u32Hash);
        self->u32Size = self->u32Size + 1;
      }
    }
    else {
      if ((self->pDestructor != (_func_void_void_ptr *)0x0) && (paVar2->val != (void *)0x0)) {
        (*self->pDestructor)(paVar2->val);
      }
      paVar2->val = pVal;
    }
  }
  return;
}

Assistant:

void adt_hash_set(adt_hash_t *self, const char *pKey, void *pVal){
	if(self && pKey){
		uint32_t u32HashVal = adt_hash_string(pKey);
		adt_hkey_t *hkey = adt_hnode_find(self->root,pKey,u32HashVal);
		if(hkey){
			//already in hash table
			if(self->pDestructor && hkey->val){
				self->pDestructor(hkey->val);
			}
			hkey->val = pVal;
		}
		else{
			//not found
			hkey = adt_hkey_new(pKey,pVal);
			if(hkey){
				adt_hnode_insert(self->root,hkey,u32HashVal);
				self->u32Size++;
			}
		}
	}
}